

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.h
# Opt level: O2

string * __thiscall
TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>
::GetConstraintsPrintout_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  lVar1 = *(long *)((long)this + 200);
  iVar4 = 0;
  for (lVar3 = *(long *)((long)this + 0xc0); lVar3 != lVar1; lVar3 = lVar3 + 0x48) {
    poVar2 = std::operator<<((ostream *)&oss,"Max");
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    std::operator<<(poVar2,":  ");
    std::endl<char,std::char_traits<char>>((ostream *)&oss);
    iVar4 = iVar4 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string GetConstraintsPrintout() const {
    std::ostringstream oss;
    int i=0;
    for (const auto& con: constr_) {
      oss << con.GetTypeName() << ' ' << (i++)
          << ":  ";
//      con.print(oss);
      oss << std::endl;
    }
    return oss.str();
  }